

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O0

void k053260_write(void *chip,UINT8 offset,UINT8 data)

{
  byte bVar1;
  int local_24;
  UINT8 rising_edge;
  int i;
  k053260_state *info;
  UINT8 data_local;
  UINT8 offset_local;
  void *chip_local;
  
  bVar1 = offset & 0x3f;
  if ((bVar1 < 8) || (0x27 < bVar1)) {
    switch(bVar1) {
    case 2:
    case 3:
      *(UINT8 *)((long)chip + (ulong)bVar1 + 8) = data;
      break;
    case 0x28:
      bVar1 = *(byte *)((long)chip + 0xc);
      for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
        if (((uint)(data & (bVar1 ^ 0xff)) & 1 << ((byte)local_24 & 0x1f)) == 0) {
          if (((uint)data & 1 << ((byte)local_24 & 0x1f)) == 0) {
            KDSC_key_off((KDSC_Voice *)((long)chip + (long)local_24 * 0x28 + 0x10));
          }
        }
        else {
          KDSC_key_on((KDSC_Voice *)((long)chip + (long)local_24 * 0x28 + 0x10));
        }
      }
      *(UINT8 *)((long)chip + 0xc) = data;
      break;
    case 0x2a:
      info._6_1_ = data;
      for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
        KDSC_set_loop_kadpcm((KDSC_Voice *)((long)chip + (long)local_24 * 0x28 + 0x10),info._6_1_);
        info._6_1_ = (byte)((int)(uint)info._6_1_ >> 1);
      }
      break;
    case 0x2c:
      KDSC_set_pan((KDSC_Voice *)((long)chip + 0x10),data);
      KDSC_set_pan((KDSC_Voice *)((long)chip + 0x38),(UINT8)((int)(uint)data >> 3));
      break;
    case 0x2d:
      KDSC_set_pan((KDSC_Voice *)((long)chip + 0x60),data);
      KDSC_set_pan((KDSC_Voice *)((long)chip + 0x88),(UINT8)((int)(uint)data >> 3));
      break;
    case 0x2f:
      *(UINT8 *)((long)chip + 0xd) = data;
    }
  }
  else {
    KDSC_set_register((KDSC_Voice *)((long)chip + (long)((int)(bVar1 - 8) / 8) * 0x28 + 0x10),bVar1,
                      data);
  }
  return;
}

Assistant:

static void k053260_write(void* chip, UINT8 offset, UINT8 data)
{
	k053260_state *info = (k053260_state *)chip;
	int i;

	offset &= 0x3f;

	// per voice registers
	if ((offset >= 0x08) && (offset <= 0x27))
	{
		KDSC_set_register(&info->voice[(offset - 8) / 8], offset, data);
		return;
	}

	switch (offset)
	{
		// 0x00 and 0x01 are read registers

		case 0x02: // sub-to-main ports
		case 0x03:
			info->portdata[offset] = data;
			break;

		// 0x04 through 0x07 seem to be unused

		case 0x28: // key on/off
		{
			UINT8 rising_edge = data & ~info->keyon;

			for (i = 0; i < 4; i++)
			{
				if (rising_edge & (1 << i))
					KDSC_key_on(&info->voice[i]);
				else if (!(data & (1 << i)))
					KDSC_key_off(&info->voice[i]);
			}
			info->keyon = data;
			break;
		}

		// 0x29 is a read register

		case 0x2a: // loop and pcm/adpcm select
			for (i = 0; i < 4; i++)
			{
				KDSC_set_loop_kadpcm(&info->voice[i], data);
				data >>= 1;
			}
			break;

		// 0x2b seems to be unused

		case 0x2c: // pan, voices 0 and 1
			KDSC_set_pan(&info->voice[0], data);
			KDSC_set_pan(&info->voice[1], data >> 3);
			break;

		case 0x2d: // pan, voices 2 and 3
			KDSC_set_pan(&info->voice[2], data);
			KDSC_set_pan(&info->voice[3], data >> 3);
			break;

		// 0x2e is a read register

		case 0x2f: // control
			info->mode = data;
			// bit 0 = enable ROM read from register 0x2e
			// bit 1 = enable sound output
			// bit 2 = enable aux input?
			//   (set by all games except Golfing Greats and Rollergames, both of which
			//    don't have a YM2151. Over Drive only sets it on one of the two chips)
			// bit 3 = aux input or ROM sharing related?
			//   (only set by Over Drive, and only on the same chip that bit 2 is set on)
			break;

		default:
			logerror("Write to unknown K053260 register %02x (data = %02x)\n",
					offset, data);
	}
}